

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

bool __thiscall
ArmParser::parsePsrTransfer
          (ArmParser *this,Parser *parser,ArmOpcodeVariables *vars,bool shortVersion)

{
  bool bVar1;
  Token *this_00;
  Identifier *this_01;
  string *str;
  long lVar2;
  char *pcVar3;
  undefined1 *puVar4;
  int local_4c;
  long lStack_48;
  int i;
  size_t pos;
  string *stringValue;
  Token *token;
  bool shortVersion_local;
  ArmOpcodeVariables *vars_local;
  Parser *parser_local;
  ArmParser *this_local;
  
  this_00 = Parser::nextToken(parser);
  if (this_00->type == Identifier) {
    this_01 = Token::identifierValue(this_00);
    str = Identifier::string_abi_cxx11_(this_01);
    bVar1 = startsWith(str,"cpsr",0);
    if (bVar1) {
      (vars->PsrData).spsr = false;
    }
    else {
      bVar1 = startsWith(str,"spsr",0);
      if (!bVar1) {
        return false;
      }
      (vars->PsrData).spsr = true;
    }
    if (shortVersion) {
      lVar2 = std::__cxx11::string::size();
      this_local._7_1_ = lVar2 == 4;
    }
    else {
      lVar2 = std::__cxx11::string::size();
      if (lVar2 == 4) {
        (vars->PsrData).field = 0xf;
        this_local._7_1_ = true;
      }
      else {
        lStack_48 = 5;
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
        if (*pcVar3 == '_') {
          bVar1 = startsWith(str,"ctl",5);
          if (bVar1) {
            (vars->PsrData).field = 1;
            lVar2 = std::__cxx11::string::size();
            this_local._7_1_ = lVar2 == 8;
          }
          else {
            bVar1 = startsWith(str,"flg",5);
            if (bVar1) {
              (vars->PsrData).field = 8;
              lVar2 = std::__cxx11::string::size();
              this_local._7_1_ = lVar2 == 8;
            }
            else {
              (vars->PsrData).field = 0;
              local_4c = 0;
              while ((local_4c < 4 && (lVar2 = std::__cxx11::string::size(), lStack_48 != lVar2))) {
                lStack_48 = lStack_48 + 1;
                puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)str);
                switch(*puVar4) {
                case 99:
                  if (((vars->PsrData).field & 1U) != 0) {
                    return false;
                  }
                  (vars->PsrData).field = (vars->PsrData).field | 1;
                  break;
                default:
                  return false;
                case 0x66:
                  if (((vars->PsrData).field & 8U) != 0) {
                    return false;
                  }
                  (vars->PsrData).field = (vars->PsrData).field | 8;
                  break;
                case 0x73:
                  if (((vars->PsrData).field & 4U) != 0) {
                    return false;
                  }
                  (vars->PsrData).field = (vars->PsrData).field | 4;
                  break;
                case 0x78:
                  if (((vars->PsrData).field & 2U) != 0) {
                    return false;
                  }
                  (vars->PsrData).field = (vars->PsrData).field | 2;
                }
                local_4c = local_4c + 1;
              }
              this_local._7_1_ = true;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ArmParser::parsePsrTransfer(Parser& parser, ArmOpcodeVariables& vars, bool shortVersion)
{
	const Token& token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;

	const std::string &stringValue = token.identifierValue().string();
	size_t pos = 0;
	if (startsWith(stringValue,"cpsr"))
	{
		vars.PsrData.spsr = false;
		pos = 4;
	} else if (startsWith(stringValue,"spsr"))
	{
		vars.PsrData.spsr = true;
		pos = 4;
	} else {
		return false;
	}

	if (shortVersion)
		return pos == stringValue.size();

	if (pos == stringValue.size())
	{
		vars.PsrData.field = 0xF;
		return true;
	}

	if (stringValue[pos++] != '_')
		return false;

	if (startsWith(stringValue,"ctl",pos))
	{
		vars.PsrData.field = 1;
		return pos+3 == stringValue.size();
	} 
	
	if (startsWith(stringValue,"flg",pos))
	{
		vars.PsrData.field = 8;
		return pos+3 == stringValue.size();
	}
	
	vars.PsrData.field = 0;
	for (int i = 0; i < 4; i++)
	{
		if (pos == stringValue.size())
			break;

		switch(stringValue[pos++])
		{
		case 'f':
			if (vars.PsrData.field & 8)
				return false;	// can only appear once
			vars.PsrData.field |= 8;
			break;
		case 's':
			if (vars.PsrData.field & 4)
				return false;	// can only appear once
			vars.PsrData.field |= 4;
			break;
		case 'x':
			if (vars.PsrData.field & 2)
				return false;	// can only appear once
			vars.PsrData.field |= 2;
			break;
		case 'c':
			if (vars.PsrData.field & 1)
				return false;	// can only appear once
			vars.PsrData.field |= 1;
			break;
		default:
			return false;	// has to be one of those
		}
	}

	return true;
}